

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int gost_cipher_set_param(ossl_gost_cipher_ctx *c,int nid)

{
  ASN1_OBJECT *obj;
  gost_cipher_info *pgVar1;
  
  if (nid == 0) {
    obj = (ASN1_OBJECT *)0x0;
  }
  else {
    obj = OBJ_nid2obj(nid);
  }
  pgVar1 = get_encryption_params((ASN1_OBJECT *)obj);
  if (pgVar1 != (gost_cipher_info *)0x0) {
    c->paramNID = pgVar1->nid;
    c->key_meshing = pgVar1->key_meshing;
    c->count = 0;
    gost_init(&c->cctx,pgVar1->sblock);
  }
  return (uint)(pgVar1 != (gost_cipher_info *)0x0);
}

Assistant:

static int gost_cipher_set_param(struct ossl_gost_cipher_ctx *c, int nid)
{
    const struct gost_cipher_info *param;
    param = get_encryption_params((nid == NID_undef ? NULL : OBJ_nid2obj(nid)));
    if (!param)
        return 0;

    c->paramNID = param->nid;
    c->key_meshing = param->key_meshing;
    c->count = 0;
    gost_init(&(c->cctx), param->sblock);
    return 1;
}